

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint64_t helper_tre(CPUS390XState_conflict *env,uint64_t array,uint64_t len,uint64_t trans)

{
  uint64_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uintptr_t unaff_retaddr;
  char local_4c;
  
  uVar4 = (ulong)((uint)array & 0x7fffffff);
  uVar6 = len & 0xffffffff;
  if (((env->psw).mask & 0x100000000) != 0) {
    uVar4 = array;
    uVar6 = len;
  }
  uVar3 = (uint)(0x2000 < uVar6) * 3;
  uVar5 = 0x2000;
  if (uVar6 < 0x2000) {
    uVar5 = uVar6;
  }
  if (uVar6 == 0) {
    uVar5 = 0;
  }
  else {
    uVar1 = env->regs[0];
    uVar6 = 0;
    do {
      uVar2 = cpu_ldub_data_ra_s390x(env,uVar4 + uVar6,unaff_retaddr);
      local_4c = (char)(int)uVar1;
      if ((char)uVar2 == local_4c) {
        uVar3 = 1;
        uVar5 = uVar6;
        break;
      }
      uVar2 = cpu_ldub_data_ra_s390x(env,(uVar2 & 0xff) + trans,unaff_retaddr);
      cpu_stb_data_ra_s390x(env,uVar4 + uVar6,uVar2 & 0xff,unaff_retaddr);
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  env->cc_op = uVar3;
  env->retxl = len - uVar5;
  return uVar4 + uVar5;
}

Assistant:

uint64_t HELPER(tre)(CPUS390XState *env, uint64_t array,
                     uint64_t len, uint64_t trans)
{
    uintptr_t ra = GETPC();
    uint8_t end = env->regs[0] & 0xff;
    uint64_t l = len;
    uint64_t i;
    uint32_t cc = 0;

    if (!(env->psw.mask & PSW_MASK_64)) {
        array &= 0x7fffffff;
        l = (uint32_t)l;
    }

    /* Lest we fail to service interrupts in a timely manner, limit the
       amount of work we're willing to do.  For now, let's cap at 8k.  */
    if (l > 0x2000) {
        l = 0x2000;
        cc = 3;
    }

    for (i = 0; i < l; i++) {
        uint8_t byte, new_byte;

        byte = cpu_ldub_data_ra(env, array + i, ra);

        if (byte == end) {
            cc = 1;
            break;
        }

        new_byte = cpu_ldub_data_ra(env, trans + byte, ra);
        cpu_stb_data_ra(env, array + i, new_byte, ra);
    }

    env->cc_op = cc;
    env->retxl = len - i;
    return array + i;
}